

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

State * __thiscall re2::DFA::WorkqToCachedState(DFA *this,Workq *q,Workq *mq,uint32_t flag)

{
  int iVar1;
  Prog *pPVar2;
  Inst *pIVar3;
  bool bVar4;
  int *inst;
  MatchKind MVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  int ninst;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  long lVar14;
  int *piVar15;
  byte bVar16;
  State *pSStack_60;
  uint local_54;
  int *ip;
  
  lVar7 = (long)q->maxmark_ + (long)q->n_;
  uVar11 = 0xffffffffffffffff;
  if (-1 < (int)lVar7) {
    uVar11 = lVar7 * 4;
  }
  inst = (int *)operator_new__(uVar11);
  piVar15 = ((_Head_base<0UL,_int_*,_false> *)
            ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                    super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->_M_head_impl;
  uVar12 = flag & 0x100;
  bVar13 = false;
  bVar16 = 0;
  local_54 = 0;
  uVar11 = 0;
  for (piVar9 = piVar15; ninst = (int)uVar11, piVar9 != piVar15 + (q->super_SparseSet).size_;
      piVar9 = piVar9 + 1) {
    iVar1 = *piVar9;
    if ((bVar16 & 1) == 0) {
      iVar8 = q->n_;
    }
    else if ((this->kind_ == kFirstMatch) || (iVar8 = q->n_, iVar8 <= iVar1)) break;
    if (iVar1 < iVar8) {
      pIVar3 = (this->prog_->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + iVar1;
      if (((pIVar3->out_opcode_ & 7) == 1) && (MVar5 = this->kind_, MVar5 != kManyMatch)) {
        if (MVar5 == kFirstMatch) {
          if ((piVar9 != piVar15) || (bVar4 = Prog::Inst::greedy(pIVar3,this->prog_), !bVar4))
          goto LAB_001add72;
          MVar5 = this->kind_;
        }
        if (MVar5 == kLongestMatch) {
          if (uVar12 != 0 && !bVar13) {
LAB_001adefb:
            pSStack_60 = (State *)0x2;
            goto LAB_001adee1;
          }
        }
        else if (uVar12 != 0) goto LAB_001adefb;
      }
LAB_001add72:
      pPVar2 = this->prog_;
      if ((((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
           ((long)&(pPVar2->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
           + 8))->_M_head_impl[(long)iVar1 + -1].out_opcode_ & 8) != 0) {
        uVar11 = (ulong)(ninst + 1);
        inst[ninst] = *piVar9;
      }
      uVar6 = pIVar3->out_opcode_ & 7;
      uVar10 = uVar11;
      if (uVar6 == 5) {
        bVar16 = bVar16 | pPVar2->anchor_end_ ^ 1U;
      }
      else if (uVar6 == 4) {
        local_54 = local_54 | (pIVar3->field_1).out1_;
      }
    }
    else {
      uVar10 = uVar11;
      if ((0 < ninst) && (inst[uVar11 - 1] != -1)) {
        uVar10 = (ulong)(ninst + 1);
        inst[uVar11] = -1;
        bVar13 = true;
      }
    }
    piVar15 = ((_Head_base<0UL,_int_*,_false> *)
              ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                      super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->_M_head_impl
    ;
    uVar11 = uVar10;
  }
  if (0 < ninst) {
    ninst = ninst - (uint)(inst[uVar11 - 1] == -1);
  }
  if (local_54 == 0) {
    flag = uVar12;
  }
  if (ninst == 0 && flag == 0) {
    pSStack_60 = (State *)0x1;
  }
  else {
    MVar5 = this->kind_;
    if (MVar5 == kLongestMatch) {
      for (piVar15 = inst; piVar15 < inst + ninst; piVar15 = (int *)(lVar7 + (long)piVar15)) {
        for (; piVar15 < inst + ninst; piVar15 = piVar15 + 1) {
          lVar7 = 4;
          if (*piVar15 == -1) goto LAB_001ade23;
        }
        lVar7 = 0;
LAB_001ade23:
        std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>();
      }
      MVar5 = this->kind_;
    }
    if (MVar5 == kManyMatch) {
      std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(inst);
    }
    if (mq != (Workq *)0x0) {
      inst[ninst] = -2;
      piVar15 = ((_Head_base<0UL,_int_*,_false> *)
                ((long)&(mq->super_SparseSet).dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->
                _M_head_impl;
      iVar1 = (mq->super_SparseSet).size_;
      pPVar2 = this->prog_;
      ninst = ninst + 1;
      for (lVar7 = 0; (long)iVar1 * 4 != lVar7; lVar7 = lVar7 + 4) {
        iVar8 = *(int *)((long)piVar15 + lVar7);
        pIVar3 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                 ((long)&(pPVar2->inst_).ptr_._M_t.
                         super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                 + 8))->_M_head_impl;
        if ((pIVar3[iVar8].out_opcode_ & 7) == 5) {
          lVar14 = (long)ninst;
          ninst = ninst + 1;
          *(anon_union_4_5_a3ff96c3_for_Inst_2 *)(inst + lVar14) = pIVar3[iVar8].field_1;
        }
      }
    }
    pSStack_60 = CachedState(this,inst,ninst,flag | local_54 << 0x10);
  }
LAB_001adee1:
  operator_delete__(inst);
  return pSStack_60;
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, Workq* mq, uint32_t flag) {
  //mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  int* inst = new int[q->size()];
  int n = 0;
  uint32_t needflags = 0;  // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;   // whether queue contains guaranteed kInstMatch
  bool sawmark = false;    // whether queue contains a Mark
  if (ExtraDebug)
    fprintf(stderr, "WorkqToCachedState %s [%#x]", DumpWorkq(q).c_str(), flag);
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          delete[] inst;
          if (ExtraDebug)
            fprintf(stderr, " -> FullMatchState\n");
          return FullMatchState;
        }
        FALLTHROUGH_INTENDED;
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    delete[] inst;
    if (ExtraDebug)
      fprintf(stderr, " -> DeadState\n");
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst;
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      std::sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // If we're in many match mode, canonicalize for similar reasons:
  // we have an unordered set of states (i.e. we don't have Marks)
  // and sorting will reduce the number of distinct sets stored.
  if (kind_ == Prog::kManyMatch) {
    int* ip = inst;
    int* ep = ip + n;
    std::sort(ip, ep);
  }

  // Append MatchSep and the match IDs in mq if necessary.
  if (mq != NULL) {
    inst[n++] = MatchSep;
    for (Workq::iterator i = mq->begin(); i != mq->end(); ++i) {
      int id = *i;
      Prog::Inst* ip = prog_->inst(id);
      if (ip->opcode() == kInstMatch)
        inst[n++] = ip->match_id();
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst, n, flag);
  delete[] inst;
  return state;
}